

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall tf::Node::_set_up_join_counter(Node *this)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  __int_type_conflict1 _Var4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  pvVar1 = (this->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  pvVar2 = (this->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  uVar5 = this->_nstate;
  _Var4 = 0;
  for (uVar3 = this->_num_successors; uVar3 < (ulong)((long)pvVar1 - (long)pvVar2 >> 3);
      uVar3 = uVar3 + 1) {
    bVar7 = (*(byte *)(*(long *)((long)pvVar2 + uVar3 * 8) + 0xc0) & 0xfe) == 4;
    uVar6 = (uint)bVar7;
    uVar5 = uVar5 + uVar6 | uVar6 << 0x1c;
    this->_nstate = uVar5;
    _Var4 = _Var4 + !bVar7;
  }
  (this->_join_counter).super___atomic_base<unsigned_long>._M_i = _Var4;
  return;
}

Assistant:

inline void Node::_set_up_join_counter() {
  size_t c = 0;
  //for(auto p : _predecessors) {
  for(size_t i=_num_successors; i<_edges.size(); i++) {
    bool is_cond = _edges[i]->_is_conditioner();
    _nstate = (_nstate + is_cond) | (is_cond * NSTATE::CONDITIONED);  // weak dependency
    c += !is_cond;  // strong dependency
  }
  _join_counter.store(c, std::memory_order_relaxed);
}